

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psl.c
# Opt level: O2

void Curl_psl_destroy(PslCache *pslcache)

{
  byte bVar1;
  
  if (pslcache->psl != (psl_ctx_t *)0x0) {
    bVar1 = pslcache->field_0x10;
    if ((bVar1 & 1) != 0) {
      psl_free();
      bVar1 = pslcache->field_0x10;
    }
    pslcache->psl = (psl_ctx_t *)0x0;
    pslcache->field_0x10 = bVar1 & 0xfe;
  }
  return;
}

Assistant:

void Curl_psl_destroy(struct PslCache *pslcache)
{
  if(pslcache->psl) {
    if(pslcache->dynamic)
      psl_free((psl_ctx_t *)CURL_UNCONST(pslcache->psl));
    pslcache->psl = NULL;
    pslcache->dynamic = FALSE;
  }
}